

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_encode(opj_mqc_t *mqc,int d)

{
  int in_ESI;
  long in_RDI;
  
  if (*(int *)(**(long **)(in_RDI + 0xc0) + 4) == in_ESI) {
    mqc_codemps((opj_mqc_t *)0x16b98f);
  }
  else {
    mqc_codelps((opj_mqc_t *)0x16b99b);
  }
  return;
}

Assistant:

void mqc_encode(opj_mqc_t *mqc, int d) {
	if ((*mqc->curctx)->mps == d) {
		mqc_codemps(mqc);
	} else {
		mqc_codelps(mqc);
	}
}